

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreImporter.cpp
# Opt level: O1

void __thiscall Assimp::Ogre::OgreImporter::SetupProperties(OgreImporter *this,Importer *pImp)

{
  int iVar1;
  string local_60;
  string local_40;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Scene.material","");
  Importer::GetPropertyString(&local_40,pImp,"IMPORT_OGRE_MATERIAL_FILE",&local_60);
  std::__cxx11::string::_M_assign((string *)&this->m_userDefinedMaterialLibFile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  iVar1 = Importer::GetPropertyInteger(pImp,"IMPORT_OGRE_TEXTURETYPE_FROM_FILENAME",0);
  this->m_detectTextureTypeFromFilename = iVar1 != 0;
  return;
}

Assistant:

void OgreImporter::SetupProperties(const Importer* pImp)
{
    m_userDefinedMaterialLibFile = pImp->GetPropertyString(AI_CONFIG_IMPORT_OGRE_MATERIAL_FILE, "Scene.material");
    m_detectTextureTypeFromFilename = pImp->GetPropertyBool(AI_CONFIG_IMPORT_OGRE_TEXTURETYPE_FROM_FILENAME, false);
}